

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

shared_ptr<unsigned_char> __thiscall
pstore::storage::address_to_pointer<unsigned_char>(storage *this,typed_address<unsigned_char> addr)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<unsigned_char> sVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  storage *this_local;
  typed_address<unsigned_char> addr_local;
  
  local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)addr.a_.a_;
  addr_local.a_.a_ = (address)(address)this;
  typed_address<unsigned_char>::to_address((typed_address<unsigned_char> *)&this_local);
  address_to_pointer((storage *)&stack0xffffffffffffffd0,addr.a_.a_);
  std::static_pointer_cast<unsigned_char,void>((shared_ptr<void> *)this);
  std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)&stack0xffffffffffffffd0);
  sVar1.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<unsigned_char>)
         sVar1.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> address_to_pointer (typed_address<T> const addr) noexcept {
            return std::static_pointer_cast<T> (address_to_pointer (addr.to_address ()));
        }